

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O3

shared_ptr<celero::Experiment> __thiscall celero::Benchmark::getExperiment(Benchmark *this,size_t x)

{
  int *piVar1;
  long lVar2;
  _Head_base<0UL,_celero::Benchmark::Impl_*,_false> _Var3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  shared_ptr<celero::Experiment> sVar4;
  shared_ptr<celero::Experiment> sVar5;
  shared_ptr<celero::Experiment> sVar6;
  
  lVar2 = *(long *)(*(long *)x + 0x68);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long *)(*(long *)x + 0x70) - lVar2 >> 4)) {
    in_RDX._M_pi = in_RDX._M_pi * 0x10;
    (this->pimpl)._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)
         ((_Head_base<0UL,_celero::Benchmark::Impl_*,_false> *)
         ((long)&(in_RDX._M_pi)->_vptr__Sp_counted_base + lVar2))->_M_head_impl;
    _Var3._M_head_impl =
         ((_Head_base<0UL,_celero::Benchmark::Impl_*,_false> *)
         ((long)&(in_RDX._M_pi)->_M_use_count + lVar2))->_M_head_impl;
    this[1].pimpl._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)_Var3._M_head_impl;
    if (_Var3._M_head_impl != (Impl *)0x0) {
      if (__libc_single_threaded != '\0') {
        piVar1 = (int *)((long)&(_Var3._M_head_impl)->stats + 8);
        *piVar1 = *piVar1 + 1;
        sVar4.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
        sVar4.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)this;
        return (shared_ptr<celero::Experiment>)
               sVar4.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>;
      }
      LOCK();
      piVar1 = (int *)((long)&(_Var3._M_head_impl)->stats + 8);
      *piVar1 = *piVar1 + 1;
      UNLOCK();
      sVar6.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      sVar6.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<celero::Experiment>)
             sVar6.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>;
    }
  }
  else {
    (this->pimpl)._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)0x0;
    this[1].pimpl._pimpl._M_t.
    super___uniq_ptr_impl<celero::Benchmark::Impl,_std::default_delete<celero::Benchmark::Impl>_>.
    _M_t.
    super__Tuple_impl<0UL,_celero::Benchmark::Impl_*,_std::default_delete<celero::Benchmark::Impl>_>
    .super__Head_base<0UL,_celero::Benchmark::Impl_*,_false> =
         (_Head_base<0UL,_celero::Benchmark::Impl_*,_false>)0x0;
  }
  sVar5.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<celero::Experiment>)
         sVar5.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Experiment> Benchmark::getExperiment(size_t x)
{
	if(x < this->pimpl->experiments.size())
	{
		return this->pimpl->experiments[x];
	}

	return nullptr;
}